

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_238a35::SndioCapture::stop(SndioCapture *this)

{
  bool bVar1;
  int iVar2;
  thread *in_RDI;
  
  bVar1 = std::atomic<bool>::exchange((atomic<bool> *)(in_RDI + 4),true,memory_order_acq_rel);
  if ((!bVar1) && (bVar1 = std::thread::joinable(in_RDI), bVar1)) {
    std::thread::join();
    iVar2 = sio_stop(in_RDI[2]._M_id._M_thread);
    if ((iVar2 == 0) && (0 < (int)gLogLevel)) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Error stopping device\n");
    }
  }
  return;
}

Assistant:

void SndioCapture::stop()
{
    if(mKillNow.exchange(true, std::memory_order_acq_rel) || !mThread.joinable())
        return;
    mThread.join();

    if(!sio_stop(mSndHandle))
        ERR("Error stopping device\n");
}